

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int hydro_pad(uchar *buf,size_t unpadded_buflen,size_t blocksize,size_t max_buflen)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uchar mask;
  
  iVar4 = -1;
  if (max_buflen < 0x80000000 && blocksize != 0) {
    uVar7 = blocksize - 1;
    if ((blocksize & uVar7) == 0) {
      uVar7 = ~unpadded_buflen & uVar7;
    }
    else {
      uVar7 = uVar7 - unpadded_buflen % blocksize;
    }
    if ((uVar7 < ~unpadded_buflen) && (uVar5 = unpadded_buflen + uVar7, uVar5 < max_buflen)) {
      pbVar6 = buf + uVar5;
      uVar2 = 0;
      mask = '\0';
      do {
        uVar3 = uVar2 ^ uVar7;
        uVar2 = uVar2 + 1;
        bVar1 = (byte)(uVar3 - 1 >> 0x38);
        *pbVar6 = bVar1 & 0x80 | *pbVar6 & mask;
        pbVar6 = pbVar6 + -1;
        mask = mask | bVar1;
      } while (blocksize != uVar2);
      iVar4 = (int)uVar5 + 1;
    }
  }
  return iVar4;
}

Assistant:

int
hydro_pad(unsigned char *buf, size_t unpadded_buflen, size_t blocksize, size_t max_buflen)
{
    unsigned char         *tail;
    size_t                 i;
    size_t                 xpadlen;
    size_t                 xpadded_len;
    volatile unsigned char mask;
    unsigned char          barrier_mask;

    if (blocksize <= 0U || max_buflen > INT_MAX) {
        return -1;
    }
    xpadlen = blocksize - 1U;
    if ((blocksize & (blocksize - 1U)) == 0U) {
        xpadlen -= unpadded_buflen & (blocksize - 1U);
    } else {
        xpadlen -= unpadded_buflen % blocksize;
    }
    if ((size_t) SIZE_MAX - unpadded_buflen <= xpadlen) {
        return -1;
    }
    xpadded_len = unpadded_buflen + xpadlen;
    if (xpadded_len >= max_buflen) {
        return -1;
    }
    tail = &buf[xpadded_len];
    mask = 0U;
    for (i = 0; i < blocksize; i++) {
        barrier_mask = (unsigned char) (((i ^ xpadlen) - 1U) >> ((sizeof(size_t) - 1U) * CHAR_BIT));
        *(tail - i)  = ((*(tail - i)) & mask) | (0x80 & barrier_mask);
        mask |= barrier_mask;
    }
    return (int) (xpadded_len + 1);
}